

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O0

void findLeakageFlows(double lamda,double *dH,double *xQ,Network *nw)

{
  int iVar1;
  int iVar2;
  Link *pLVar3;
  Node *pNVar4;
  Node *pNVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  reference ppLVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double extraout_XMM0_Qa;
  double local_90;
  double q;
  double h;
  double h2;
  double h1;
  bool canLeak2;
  bool canLeak1;
  int n2;
  int n1;
  Node *node2;
  Node *node1;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link_*,_std::allocator<Link_*>_> *__range1;
  double dqdh;
  Network *nw_local;
  double *xQ_local;
  double *dH_local;
  double lamda_local;
  
  __range1 = (vector<Link_*,_std::allocator<Link_*>_> *)0x0;
  dqdh = (double)nw;
  nw_local = (Network *)xQ;
  xQ_local = dH;
  dH_local = (double *)lamda;
  __end1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(&nw->links);
  link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(&nw->links);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                     *)&link), bVar6) {
    ppLVar9 = __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
              operator*(&__end1);
    pLVar3 = *ppLVar9;
    pLVar3->leakage = 0.0;
    __range1 = (vector<Link_*,_std::allocator<Link_*>_> *)0x0;
    uVar7 = (*(pLVar3->super_Element)._vptr_Element[0x14])();
    if ((uVar7 & 1) != 0) {
      pNVar4 = pLVar3->fromNode;
      pNVar5 = pLVar3->toNode;
      iVar1 = (pNVar4->super_Element).index;
      iVar2 = (pNVar5->super_Element).index;
      iVar8 = (*(pNVar4->super_Element)._vptr_Element[2])();
      bVar6 = iVar8 == 0;
      iVar8 = (*(pNVar5->super_Element)._vptr_Element[2])();
      bVar10 = iVar8 == 0;
      if ((bVar6) || (bVar10)) {
        dVar11 = ((double)dH_local * xQ_local[iVar1] + pNVar4->head) - pNVar4->elev;
        dVar12 = ((double)dH_local * xQ_local[iVar2] + pNVar5->head) - pNVar5->elev;
        dVar13 = (dVar11 + dVar12) / 2.0;
        if (0.0 < dVar13) {
          (*(pLVar3->super_Element)._vptr_Element[0x15])(dVar13,pLVar3,dqdh,&__range1);
          pLVar3->leakage = extraout_XMM0_Qa;
          local_90 = pLVar3->leakage / 2.0;
          if ((dVar11 * dVar12 <= 0.0) || (!bVar6 || !bVar10)) {
            local_90 = local_90 * 2.0;
          }
          if ((0.0 < dVar11) && (bVar6)) {
            pNVar4->outflow = local_90 + pNVar4->outflow;
            pNVar4->qGrad = (double)__range1 + pNVar4->qGrad;
            (&(nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start)[iVar1] =
                 (pointer)((double)(&(nw_local->graph).adjLists.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start)[iVar1] - local_90);
          }
          if ((0.0 < dVar12) && (bVar10)) {
            pNVar5->outflow = local_90 + pNVar5->outflow;
            pNVar5->qGrad = (double)__range1 + pNVar5->qGrad;
            (&(nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start)[iVar2] =
                 (pointer)((double)(&(nw_local->graph).adjLists.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start)[iVar2] - local_90);
          }
        }
      }
    }
    __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void findLeakageFlows(double lamda, double dH[], double xQ[], Network* nw)
{
    double dqdh = 0.0;  // gradient of leakage outflow w.r.t. pressure head

    for (Link* link : nw->links)
    {
        // ... skip links that don't leak

        link->leakage = 0.0;
        dqdh = 0.0;
        if ( !link->canLeak() ) continue;

        // ... identify link's end nodes and their indexes

        Node* node1 = link->fromNode;
        Node* node2 = link->toNode;
        int n1 = node1->index;
        int n2 = node2->index;

        // ... no leakage if neither end node is not a junction

        bool canLeak1 = (node1->type() == Node::JUNCTION);
        bool canLeak2 = (node2->type() == Node::JUNCTION);
        if ( !canLeak1 && !canLeak2 ) continue;

        // ... find link's average pressure head

        double h1 = node1->head + lamda * dH[n1] - node1->elev;
        double h2 = node2->head + lamda * dH[n2] - node2->elev;
        double h = (h1 + h2) / 2.0;
        if ( h <= 0.0 ) continue;

        // ... find leakage and its gradient

        link->leakage = link->findLeakage(nw, h, dqdh);

        // ... split leakage flow between end nodes, unless one cannot
        //     support leakage or has negative pressure head

        double q = link->leakage / 2.0;
        if ( h1 * h2 <= 0.0 || canLeak1 * canLeak2 == 0 ) q = 2.0 * q;

        // ... add leakage to each node's outflow

        if ( h1 > 0.0 && canLeak1 )
        {
            node1->outflow += q;
            node1->qGrad += dqdh;
            xQ[n1] -= q;
        }
        if ( h2 > 0.0 && canLeak2 )
        {
            node2->outflow += q;
            node2->qGrad += dqdh;
            xQ[n2] -= q;
        }
    }
}